

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

void __thiscall BayesianGameBase::SanityCheckBGBase(BayesianGameBase *this)

{
  bool bVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  E *this_00;
  Index jtI;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  double local_1c8;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  if (this->_m_JToverflow == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "\n!!! BayesianGameBase::SanityCheck() aborted since the joint types are overflowing. BayesianGameBase really is ill-suited for this situation and a new implementation needs to be created for this case!!! Only leaving this now such that we can run experiments for the JAAMAS paper...\n"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  if (this->_m_useSparse == false) {
    dVar6 = 0.0;
    uVar4 = 0;
    local_1c8 = 0.0;
    while( true ) {
      if ((ulong)((long)(this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
      (*(this->super_Interface_ProblemToPolicyDiscretePure).super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this,uVar4);
      uVar4 = (ulong)((int)uVar4 + 1);
      local_1c8 = local_1c8 + dVar6;
    }
  }
  else {
    p_Var3 = (this->_m_jTypeProbsSparse).data_.
             super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1c8 = 0.0;
    for (; (_Rb_tree_header *)p_Var3 !=
           &(this->_m_jTypeProbsSparse).data_.
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      local_1c8 = local_1c8 + (double)p_Var3[1]._M_parent;
    }
  }
  bVar1 = Globals::EqualProbability(local_1c8,1.0);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_190,
                             "BayesianGameBase::SanityCheck() Warning, total probability of joint types does not sum to 1.0, "
                            );
    poVar2 = std::operator<<(poVar2,"but to ");
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 0x10;
    poVar2 = std::ostream::_M_insert<double>(local_1c8);
    std::operator<<(poVar2,"! ");
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1c8 + -1.0;
    auVar5 = vandpd_avx512vl(auVar7,auVar5);
    if (1e-09 <= auVar5._0_8_) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,&ss);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    poVar2 = std::operator<<(local_190,
                             "Since the difference is < 1e-9, we should just renormalize... (not yet implemented...)"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&std::cerr,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void
BayesianGameBase::SanityCheckBGBase()
{
    double p=0.0;
    if (_m_JToverflow)
    {
        cout << "\n!!! BayesianGameBase::SanityCheck() aborted since the joint types are overflowing. BayesianGameBase really is ill-suited for this situation and a new implementation needs to be created for this case!!! Only leaving this now such that we can run experiments for the JAAMAS paper...\n"<< endl;
        return;
    }

    if(_m_useSparse)
    {
        for( SparseVector::const_iterator it = _m_jTypeProbsSparse.begin(); 
                it != _m_jTypeProbsSparse.end();
                it++)
            p += *it;
        //throw E("BayesianGameBase::SanityCheck() not yet implemented for sparse stuff");

    }
    else
    {
        for(Index jtI=0; jtI < _m_jTypeProbs.size(); jtI++)
            p += GetProbability(jtI);
    }

    if(! Globals::EqualProbability(p, 1.0) )
    {
        stringstream ss;
        ss << "BayesianGameBase::SanityCheck() Warning, total probability of joint types does not sum to 1.0, "
            << "but to "<<setprecision(16) << p<<"! ";
        if(  abs(p - 1.0) < 1e-9  )
        {
            ss << "Since the difference is < 1e-9, we should just renormalize... (not yet implemented...)"<<endl;
            cerr << ss.str();
        }
        else
            throw(E(ss));
    }
    return;
}